

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::write_const_value(t_xml_generator *this,t_const_value *value)

{
  int *piVar1;
  t_const_value_type tVar2;
  int64_t n;
  ostream *poVar3;
  string *this_00;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  allocator local_1a1;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tVar2 = t_const_value::get_type(value);
  switch(tVar2) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    std::__cxx11::string::string((string *)&local_d0,"int",(allocator *)local_1a0);
    n = t_const_value::get_integer(value);
    write_element_number<long>(this,&local_d0,n);
    this_00 = &local_d0;
    break;
  case CV_DOUBLE:
    std::__cxx11::string::string((string *)&local_f0,"double",(allocator *)local_1a0);
    write_element_number<double>(this,&local_f0,value->doubleVal_);
    this_00 = &local_f0;
    break;
  case CV_STRING:
    std::__cxx11::string::string((string *)&local_110,"string",(allocator *)local_1a0);
    std::__cxx11::string::string((string *)&local_130,(string *)&value->stringVal_);
    write_element_string(this,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    this_00 = &local_110;
    break;
  case CV_MAP:
    std::__cxx11::string::string((string *)&local_170,"map",(allocator *)local_1a0);
    write_element_start(this,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)local_1a0,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)value);
    for (; local_198._M_left != &local_198;
        local_198._M_left = (_Base_ptr)std::_Rb_tree_increment(local_198._M_left)) {
      std::__cxx11::string::string((string *)&local_70,"entry",&local_1a1);
      write_element_start(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_90,"key",&local_1a1);
      write_element_start(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      write_const_value(this,*(t_const_value **)(local_198._M_left + 1));
      write_element_end(this);
      std::__cxx11::string::string((string *)&local_b0,"value",&local_1a1);
      write_element_start(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      write_const_value(this,(t_const_value *)local_198._M_left[1]._M_parent);
      write_element_end(this);
      write_element_end(this);
    }
    write_element_end(this);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_1a0);
    return;
  case CV_LIST:
    std::__cxx11::string::string((string *)&local_150,"list",(allocator *)local_1a0);
    write_element_start(this,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
               &value->listVal_);
    for (; local_1a0 != (undefined1  [8])local_198._0_8_;
        local_1a0 = (undefined1  [8])((long)local_1a0 + 8)) {
      std::__cxx11::string::string((string *)&local_50,"entry",&local_1a1);
      write_element_start(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      write_const_value(this,*(t_const_value **)local_1a0);
      write_element_end(this);
    }
    write_element_end(this);
    std::_Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>::~_Vector_base
              ((_Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0);
    return;
  default:
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)local_1a0,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_xml_,(string *)local_1a0);
    poVar3 = std::operator<<(poVar3,"<null />");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_1a0);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    return;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void t_xml_generator::write_const_value(t_const_value* value) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    write_element_number("int", value->get_integer());
    break;

  case t_const_value::CV_DOUBLE:
    write_element_number("double", value->get_double());
    break;

  case t_const_value::CV_STRING:
    write_element_string("string", value->get_string());
    break;

  case t_const_value::CV_LIST: {
    write_element_start("list");
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_element_start("entry");
      write_const_value(*lit);
      write_element_end();
    }
    write_element_end();
    break;
  }

  case t_const_value::CV_MAP: {
    write_element_start("map");
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_element_start("entry");
      write_element_start("key");
      write_const_value(mit->first);
      write_element_end();
      write_element_start("value");
      write_const_value(mit->second);
      write_element_end();
      write_element_end();
    }
    write_element_end();
    break;
  }

  default:
    indent_up();
    f_xml_ << indent() << "<null />" << endl;
    indent_down();
    break;
  }

}